

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

base_block_t *
base_block_alloc(tsdn_t *tsdn,base_t *base,extent_hooks_t *extent_hooks,uint ind,pszind_t *pind_last
                ,size_t *extent_sn_next,size_t size,size_t alignment)

{
  uint uVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  size_t *psVar4;
  tsd_t *tsd;
  size_t sVar5;
  base_t *pbVar6;
  base_t *pbVar7;
  uint uVar8;
  pszind_t pVar9;
  base_block_t *addr_00;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  base_block_t *pbVar13;
  void *addr;
  base_block_t *addr_01;
  int iVar14;
  ulong uVar15;
  int8_t *reentrancy_level;
  int8_t *piVar16;
  pthread_mutex_t *__mutex;
  char *in_FS_OFFSET;
  _Bool local_52;
  _Bool zero;
  base_t *local_50;
  pszind_t *local_48;
  pthread_mutex_t *local_40;
  size_t *local_38;
  
  uVar12 = alignment + 0xf & 0xfffffffffffffff0;
  uVar12 = (uVar12 + 0x8f & -uVar12) + ((size + uVar12) - 1 & -uVar12);
  if (uVar12 < 0x7000000000000001) {
    uVar15 = uVar12 * 2 - 1;
    lVar11 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    uVar15 = 0xfff;
    if (0xe < (uint)lVar11) {
      uVar15 = ~(-1L << ((char)lVar11 - 3U & 0x3f));
    }
    uVar12 = (~uVar15 & uVar12 + uVar15) + 0x1fffff;
  }
  else {
    uVar12 = 0x7000000000200fff;
  }
  for (lVar11 = 0x3f; 0xdfffffffffffffffU >> lVar11 == 0; lVar11 = lVar11 + -1) {
  }
  uVar8 = (uint)lVar11;
  iVar14 = uVar8 - 0xe;
  if (uVar8 < 0xe) {
    iVar14 = 0;
  }
  uVar1 = *pind_last + 1;
  bVar10 = (char)lVar11 - 3;
  if (uVar8 < 0xf) {
    bVar10 = 0xc;
  }
  uVar8 = *pind_last;
  if (uVar1 < ((uint)(((0x6fffffffffffffffU >> (bVar10 & 0x3f)) << (bVar10 & 0x3f)) >>
                     (bVar10 & 0x3f)) & 3) + iVar14 * 4) {
    uVar8 = uVar1;
  }
  uVar15 = sz_pind2sz_tab[uVar8] + 0x1fffff;
  if (sz_pind2sz_tab[uVar8] + 0x1fffff < uVar12) {
    uVar15 = uVar12;
  }
  uVar15 = uVar15 & 0xffffffffffe00000;
  zero = true;
  local_52 = true;
  local_50 = base;
  local_40 = (pthread_mutex_t *)tsdn;
  if (extent_hooks == &extent_hooks_default) {
    addr_00 = (base_block_t *)extent_alloc_mmap((void *)0x0,uVar15,0x200000,&zero,&local_52);
  }
  else {
    local_48 = pind_last;
    local_38 = extent_sn_next;
    if (tsdn == (tsdn_t *)0x0) {
      tsd = *(tsd_t **)in_FS_OFFSET;
      if (*in_FS_OFFSET != '\0') {
        tsdn = (tsdn_t *)tsd_fetch_slow(tsd,false);
        goto LAB_0010fe3f;
      }
      piVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      in_FS_OFFSET[3] = in_FS_OFFSET[3] + '\x01';
LAB_0010fe91:
      tsdn = (tsdn_t *)tsd;
      tsd_slow_update(&tsdn->tsd);
    }
    else {
LAB_0010fe3f:
      (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level +
           '\x01';
      piVar16 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      tsd = &tsdn->tsd;
      if ((tsdn->tsd).state.repr == '\0') goto LAB_0010fe91;
    }
    addr_00 = (base_block_t *)
              (*extent_hooks->alloc)(extent_hooks,(void *)0x0,uVar15,0x200000,&zero,&local_52,ind);
    *piVar16 = *piVar16 + -1;
    extent_sn_next = local_38;
    pind_last = local_48;
    if (*piVar16 == '\0') {
      tsd_slow_update(&tsdn->tsd);
      extent_sn_next = local_38;
      pind_last = local_48;
    }
  }
  pbVar6 = local_50;
  if (addr_00 == (base_block_t *)0x0) {
    return (base_block_t *)0x0;
  }
  if ((opt_metadata_thp == metadata_thp_disabled) || (init_system_thp_mode != thp_mode_default))
  goto LAB_0011003e;
  if (opt_metadata_thp == metadata_thp_always) {
    pages_huge(addr_00,uVar15);
    goto LAB_0011003e;
  }
  if (local_50 == (base_t *)0x0 || opt_metadata_thp != metadata_thp_auto) goto LAB_0011003e;
  __mutex = (pthread_mutex_t *)((long)&(local_50->mtx).field_0 + 0x40);
  local_48 = pind_last;
  iVar14 = pthread_mutex_trylock(__mutex);
  if (iVar14 != 0) {
    malloc_mutex_lock_slow(&pbVar6->mtx);
    (pbVar6->mtx).field_0.field_0.locked.repr = true;
  }
  pbVar7 = local_50;
  puVar2 = &(pbVar6->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((pthread_mutex_t *)(pbVar6->mtx).field_0.field_0.prof_data.prev_owner != local_40) {
    (pbVar6->mtx).field_0.field_0.prof_data.prev_owner = (tsdn_t *)local_40;
    ppwVar3 = &(pbVar6->mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  bVar10 = pbVar6->auto_thp_switched;
  if ((_Bool)bVar10 == false) {
    addr_01 = pbVar6->blocks;
    if (pbVar6->ind == 0) {
      lVar11 = 4;
      pbVar13 = addr_01;
      do {
        pbVar13 = pbVar13->next;
        lVar11 = lVar11 + -1;
      } while (pbVar13 != (base_block_t *)0x0);
    }
    else {
      lVar11 = 1;
      pbVar13 = addr_01;
      do {
        pbVar13 = pbVar13->next;
        lVar11 = lVar11 + -1;
      } while (pbVar13 != (base_block_t *)0x0);
    }
    if (lVar11 != 0) goto LAB_0011000f;
    local_50->auto_thp_switched = true;
    if (addr_01 != (base_block_t *)0x0) {
      do {
        local_40 = __mutex;
        pages_huge(addr_01,addr_01->size);
        psVar4 = &pbVar7->n_thp;
        *psVar4 = *psVar4 + ((addr_01->size - (addr_01->extent).field_2.e_size_esn) + 0x1fffff >>
                            0x15);
        addr_01 = addr_01->next;
        __mutex = local_40;
      } while (addr_01 != (base_block_t *)0x0);
      bVar10 = pbVar7->auto_thp_switched;
      goto LAB_0011000f;
    }
LAB_00110013:
    pages_huge(addr_00,uVar15);
  }
  else {
LAB_0011000f:
    if ((bVar10 & 1) != 0) goto LAB_00110013;
  }
  (local_50->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  pind_last = local_48;
LAB_0011003e:
  if (uVar15 < 0x7000000000000001) {
    uVar12 = uVar15 * 2 - 1;
    lVar11 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    uVar8 = (uint)lVar11;
    iVar14 = uVar8 - 0xe;
    if (uVar8 < 0xe) {
      iVar14 = 0;
    }
    bVar10 = (char)lVar11 - 3;
    if (uVar8 < 0xf) {
      bVar10 = 0xc;
    }
    pVar9 = ((uint)(((uVar15 - 1 >> (bVar10 & 0x3f)) << (bVar10 & 0x3f)) >> (bVar10 & 0x3f)) & 3) +
            iVar14 * 4;
  }
  else {
    pVar9 = 199;
  }
  *pind_last = pVar9;
  addr_00->size = uVar15;
  addr_00->next = (base_block_t *)0x0;
  sVar5 = *extent_sn_next;
  *extent_sn_next = sVar5 + 1;
  (addr_00->extent).e_addr = addr_00 + 1;
  (addr_00->extent).field_2.e_size_esn = uVar15 - 0x90;
  (addr_00->extent).e_bits =
       ((addr_00->extent).e_bits & 0x3fffc000000) + (sVar5 << 0x2a) + 0x3a0efff;
  return addr_00;
}

Assistant:

static base_block_t *
base_block_alloc(tsdn_t *tsdn, base_t *base, extent_hooks_t *extent_hooks,
    unsigned ind, pszind_t *pind_last, size_t *extent_sn_next, size_t size,
    size_t alignment) {
	alignment = ALIGNMENT_CEILING(alignment, QUANTUM);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t header_size = sizeof(base_block_t);
	size_t gap_size = ALIGNMENT_CEILING(header_size, alignment) -
	    header_size;
	/*
	 * Create increasingly larger blocks in order to limit the total number
	 * of disjoint virtual memory ranges.  Choose the next size in the page
	 * size class series (skipping size classes that are not a multiple of
	 * HUGEPAGE), or a size large enough to satisfy the requested size and
	 * alignment, whichever is larger.
	 */
	size_t min_block_size = HUGEPAGE_CEILING(sz_psz2u(header_size + gap_size
	    + usize));
	pszind_t pind_next = (*pind_last + 1 < sz_psz2ind(SC_LARGE_MAXCLASS)) ?
	    *pind_last + 1 : *pind_last;
	size_t next_block_size = HUGEPAGE_CEILING(sz_pind2sz(pind_next));
	size_t block_size = (min_block_size > next_block_size) ? min_block_size
	    : next_block_size;
	base_block_t *block = (base_block_t *)base_map(tsdn, extent_hooks, ind,
	    block_size);
	if (block == NULL) {
		return NULL;
	}

	if (metadata_thp_madvise()) {
		void *addr = (void *)block;
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (block_size & HUGEPAGE_MASK) == 0);
		if (opt_metadata_thp == metadata_thp_always) {
			pages_huge(addr, block_size);
		} else if (opt_metadata_thp == metadata_thp_auto &&
		    base != NULL) {
			/* base != NULL indicates this is not a new base. */
			malloc_mutex_lock(tsdn, &base->mtx);
			base_auto_thp_switch(tsdn, base);
			if (base->auto_thp_switched) {
				pages_huge(addr, block_size);
			}
			malloc_mutex_unlock(tsdn, &base->mtx);
		}
	}

	*pind_last = sz_psz2ind(block_size);
	block->size = block_size;
	block->next = NULL;
	assert(block_size >= header_size);
	base_extent_init(extent_sn_next, &block->extent,
	    (void *)((uintptr_t)block + header_size), block_size - header_size);
	return block;
}